

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O2

bool __thiscall
Opcode::AABBQuantizedTree::Walk
          (AABBQuantizedTree *this,GenericWalkingCallback callback,void *user_data)

{
  if (callback != (GenericWalkingCallback)0x0) {
    Walk(bool(*)(void_const*,void*),void*)::
    AABBQuantizedNode_const__bool_____void_const__void___void__(this->mNodes,callback,user_data);
  }
  return callback != (GenericWalkingCallback)0x0;
}

Assistant:

bool AABBQuantizedTree::Walk(GenericWalkingCallback callback, void* user_data) const
{
	if(!callback)	return false;

	struct Local
	{
		static void _Walk(const AABBQuantizedNode* current_node, GenericWalkingCallback callback, void* user_data)
		{
			if(!current_node || !(callback)(current_node, user_data))	return;

			if(!current_node->IsLeaf())
			{
				_Walk(current_node->GetPos(), callback, user_data);
				_Walk(current_node->GetNeg(), callback, user_data);
			}
		}
	};
	Local::_Walk(mNodes, callback, user_data);
	return true;
}